

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_protect.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_22f865::mock_region_factory::init(mock_region_factory *this,EVP_PKEY_CTX *ctx)

{
  uint64_t bytes_to_map;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> builder;
  __shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> local_60;
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  local_50;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> local_48;
  
  std::__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,
             (__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2> *)(ctx + 0x18));
  bytes_to_map = (local_70._M_ptr)->eof_;
  std::__shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,&local_70);
  pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::
  region_builder(&local_48,(shared_ptr<pstore::file::in_memory> *)&local_60,*(uint64_t *)(ctx + 8),
                 *(uint64_t *)(ctx + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  (this->super_factory).min_size_ = 0;
  (this->super_factory)._vptr_factory = (_func_int **)0x0;
  (this->super_factory).full_size_ = 0;
  local_50.ptr_ =
       (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
        *)this;
  pstore::gsl::
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  ::ensure_invariant(&local_50);
  pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::
  append(&local_48,local_50,0,bytes_to_map);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.file_.super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  return (int)this;
}

Assistant:

auto init () -> std::vector<pstore::region::memory_mapper_ptr> override {
            return this->create<pstore::file::in_memory, mock_mapper> (file_);
        }